

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O1

void __thiscall hwtest::pgraph::MthdDmaZcull::emulate_mthd(MthdDmaZcull *this)

{
  pgraph_state *state;
  uint32_t uVar1;
  uint uVar2;
  uint val;
  bool bVar3;
  uint uVar4;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_celsius_pre_icmd(state);
  uVar2 = (this->super_SingleMthdTest).super_MthdTest.pobj[0];
  val = uVar2 >> 0x14 | (this->super_SingleMthdTest).super_MthdTest.pobj[2] & 0x3ffff000;
  uVar4 = uVar2 & 0xfff;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_surf_limit_zcull =
       (uint)(uVar4 != 0x30) << 0x1f |
       (this->super_SingleMthdTest).super_MthdTest.pobj[1] & 0x3fffffff;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_surf_base_zcull = val;
  pgraph_celsius_icmd(state,0x2d,val,false);
  pgraph_celsius_icmd(state,0x2e,
                      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                      bundle_surf_limit_zcull,true);
  bVar3 = uVar4 != 0x30 && uVar4 != 0x3d;
  if ((uVar4 == 3) &&
     ((uVar1 = (this->super_SingleMthdTest).super_MthdTest.cls, uVar1 == 0x88 || (uVar1 == 0x38))))
  {
    bVar3 = false;
  }
  if ((bVar3) &&
     (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.debug_d & 0x800000) != 0)) {
    nv04_pgraph_blowup(state,2);
  }
  if ((uVar4 != 0x30) &&
     (((this->super_SingleMthdTest).super_MthdTest.pobj[0] & 0x30000) != 0 ||
      (uVar2 & 0x3f00000) != 0)) {
    nv04_pgraph_blowup(state,4);
  }
  uVar2 = 0;
  if ((uVar4 != 0x30) &&
     (uVar2 = (~(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.debug_d & 0x800000)
              << 6, !bVar3)) {
    uVar2 = 0x20000000;
  }
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.ctx_valid =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.ctx_valid & 0xdfffffff |
       uVar2;
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		uint32_t offset_mask = 0x3fffffff;
		uint32_t base = (pobj[2] & ~0xfff) | extr(pobj[0], 20, 12);
		uint32_t limit = pobj[1];
		uint32_t dcls = extr(pobj[0], 0, 12);
		exp.bundle_surf_limit_zcull = (limit & offset_mask) | (dcls != 0x30) << 31;
		exp.bundle_surf_base_zcull = base & offset_mask;
		pgraph_celsius_icmd(&exp, 0x2d, exp.bundle_surf_base_zcull, false);
		pgraph_celsius_icmd(&exp, 0x2e, exp.bundle_surf_limit_zcull, true);
		bool bad = true;
		if (dcls == 0x30 || dcls == 0x3d)
			bad = false;
		if (dcls == 3 && (cls == 0x38 || cls == 0x88))
			bad = false;
		if (extr(exp.debug_d, 23, 1) && bad) {
			nv04_pgraph_blowup(&exp, 0x2);
		}
		bool prot_err = false;
		if (extr(base, 0, 6))
			prot_err = true;
		if (extr(pobj[0], 16, 2))
			prot_err = true;
		if (dcls == 0x30)
			prot_err = false;
		if (prot_err)
			nv04_pgraph_blowup(&exp, 4);
		insrt(exp.ctx_valid, 29, 1, dcls != 0x30 && !(bad && extr(exp.debug_d, 23, 1)));
	}